

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O2

void test_timestamp(void)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  int32_t increment;
  int32_t timestamp;
  
  uVar2 = bson_bcon_magic();
  uVar2 = bcon_new(0,"foo",uVar2,0x10,100,1000,0);
  uVar3 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar2,"foo",uVar3,0x10,&timestamp,&increment,0);
  if (cVar1 == '\0') {
    pcVar4 = "BCON_EXTRACT (bcon, \"foo\", BCONE_TIMESTAMP (timestamp, increment))";
    uVar2 = 0xfc;
  }
  else if (timestamp == 100) {
    if (increment == 1000) {
      bson_destroy(uVar2);
      return;
    }
    pcVar4 = "increment == 1000";
    uVar2 = 0xff;
  }
  else {
    pcVar4 = "timestamp == 100";
    uVar2 = 0xfe;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar2,"test_timestamp",pcVar4);
  abort();
}

Assistant:

static void
test_timestamp (void)
{
   int32_t timestamp;
   int32_t increment;

   bson_t *bcon = BCON_NEW ("foo", BCON_TIMESTAMP (100, 1000));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_TIMESTAMP (timestamp, increment)));

   BSON_ASSERT (timestamp == 100);
   BSON_ASSERT (increment == 1000);

   bson_destroy (bcon);
}